

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Send(void *buf,int count,MPIABI_Datatype datatype,int dest,int tag,MPIABI_Comm comm)

{
  int iVar1;
  int iVar2;
  ompi_datatype_t *poVar3;
  ompi_communicator_t *poVar4;
  WPI_Handle<ompi_communicator_t_*> local_40;
  WPI_Handle<ompi_datatype_t_*> local_38;
  MPIABI_Comm local_30;
  MPIABI_Comm comm_local;
  int tag_local;
  int dest_local;
  MPIABI_Datatype datatype_local;
  void *pvStack_10;
  int count_local;
  void *buf_local;
  
  local_30 = comm;
  comm_local._0_4_ = tag;
  comm_local._4_4_ = dest;
  _tag_local = datatype;
  datatype_local._4_4_ = count;
  pvStack_10 = buf;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_38,datatype);
  poVar3 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_38);
  iVar1 = comm_local._4_4_;
  iVar2 = (int)comm_local;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle(&local_40,local_30);
  poVar4 = WPI_Handle::operator_cast_to_ompi_communicator_t_((WPI_Handle *)&local_40);
  iVar2 = MPI_Send(buf,count,poVar3,iVar1,iVar2,poVar4);
  return iVar2;
}

Assistant:

int MPIABI_Send(
  const void * buf,
  int count,
  MPIABI_Datatype datatype,
  int dest,
  int tag,
  MPIABI_Comm comm
) {
  return MPI_Send(
    buf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    dest,
    tag,
    (MPI_Comm)(WPI_Comm)comm
  );
}